

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> * __thiscall
wasm::
InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
::operator[](InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
             *this,Type *k)

{
  pointer ppVar1;
  pair<std::_List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_bool>
  pVar2;
  _List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
  local_78;
  undefined1 local_70;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  undefined1 local_38 [8];
  pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_> kv;
  Type *k_local;
  InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *this_local;
  
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kv.second.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)k;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_58);
  std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  ::
  pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
            ((pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              *)local_38,k,&local_58);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_58);
  pVar2 = insert(this,(pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                       *)local_38);
  local_78 = pVar2.first._M_node;
  local_70 = pVar2.second;
  ppVar1 = std::
           _List_iterator<std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>
           ::operator->(&local_78);
  std::pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  ::~pair((pair<const_wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
           *)local_38);
  return &ppVar1->second;
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }